

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::TrainManager::query_ticket(TrainManager *this,int argc,string *argv)

{
  bool bVar1;
  undefined8 uVar2;
  pair<unsigned_int,_bool> pVar3;
  void *pvVar4;
  string *psVar5;
  size_t sVar6;
  ostream *this_00;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  string *this_01;
  iterator iVar7;
  iterator iVar8;
  recordType rec;
  iterator __end3;
  iterator __begin3;
  vector<sjtu::recordType> *__range3;
  trainType *train;
  uint w_;
  int id;
  uint w;
  int i_1;
  recordType *record;
  vector<sjtu::recordType> records;
  uint bits [2] [512];
  pair<unsigned_int,_bool> ret_t;
  pair<unsigned_int,_bool> ret_s;
  int i;
  string keyword;
  string date;
  recordType *in_stack_ffffffffffffec28;
  vector<sjtu::recordType> *in_stack_ffffffffffffec30;
  recordType *in_stack_ffffffffffffec40;
  string *in_stack_ffffffffffffec48;
  timeType *in_stack_ffffffffffffec50;
  string *in_stack_ffffffffffffec58;
  StringHasher *in_stack_ffffffffffffec60;
  undefined7 in_stack_ffffffffffffec68;
  undefined1 in_stack_ffffffffffffec6f;
  recordType *in_stack_ffffffffffffec80;
  recordType *in_stack_ffffffffffffeca8;
  recordType *in_stack_ffffffffffffecb0;
  undefined8 in_stack_ffffffffffffecc8;
  recordType *in_stack_ffffffffffffecd0;
  trainType *in_stack_ffffffffffffecd8;
  string *local_1290;
  iterator local_11f8;
  iterator local_11e8;
  vector<sjtu::recordType> *local_11d8;
  recordType *local_11c8;
  vector<sjtu::recordType> *local_11c0;
  recordType *local_11b8;
  uint *in_stack_ffffffffffffee50;
  recordType *prVar9;
  uint in_stack_ffffffffffffee5c;
  TrainManager *in_stack_ffffffffffffee60;
  string local_1180 [32];
  undefined8 local_1160;
  undefined8 uStack_1158;
  long local_1150;
  char *local_1148;
  uint local_1140;
  int local_113c;
  uint local_1138;
  int local_1134;
  string *local_1130;
  vector<sjtu::recordType> local_1128;
  uint local_1118 [512];
  uint local_918 [514];
  string local_110 [32];
  hashType local_f0;
  uint local_e8;
  byte local_e4;
  string local_e0 [32];
  hashType local_c0;
  uint local_b8;
  byte local_b4;
  int local_b0;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_1290 = local_58;
  local_18 = in_RDX;
  local_c = in_ESI;
  do {
    std::__cxx11::string::string(local_1290);
    local_1290 = local_1290 + 0x20;
  } while (local_1290 != (string *)&local_18);
  std::__cxx11::string::string(local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_b0 = 0;
  do {
    if (local_c <= local_b0) {
      std::__cxx11::string::string(local_e0,local_58);
      local_c0 = StringHasher::operator()(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
      pVar3 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                        ((BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                          *)CONCAT17(in_stack_ffffffffffffec6f,in_stack_ffffffffffffec68),
                         (unsigned_long_long *)in_stack_ffffffffffffec60);
      local_b8 = pVar3.first;
      local_b4 = pVar3.second;
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::string(local_110,local_38);
      local_f0 = StringHasher::operator()(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
      pVar3 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                        ((BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                          *)CONCAT17(in_stack_ffffffffffffec6f,in_stack_ffffffffffffec68),
                         (unsigned_long_long *)in_stack_ffffffffffffec60);
      local_e8 = pVar3.first;
      local_e4 = pVar3.second;
      std::__cxx11::string::~string(local_110);
      if (((local_b4 & 1) == 0) || ((local_e4 & 1) == 0)) {
        pvVar4 = (void *)std::ostream::operator<<(&std::cout,0);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        bitset_query(in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c,in_stack_ffffffffffffee50);
        bitset_query(in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c,in_stack_ffffffffffffee50);
        vector<sjtu::recordType>::vector(in_stack_ffffffffffffec30);
        for (local_1134 = 0; local_1134 < 0x200; local_1134 = local_1134 + 1) {
          local_1118[local_1134] = local_918[local_1134] & local_1118[local_1134];
          while (local_1118[local_1134] != 0) {
            local_1138 = local_1118[local_1134] & -local_1118[local_1134];
            if (local_1138 != 0) {
              local_113c = -1;
              for (local_1140 = local_1138; local_1140 != 0; local_1140 = local_1140 >> 1) {
                local_113c = local_113c + 1;
              }
              local_1150 = (long)(local_1134 * 0x20 + 1 + local_113c) * 0xa7a8;
              local_1148 = (char *)(**(code **)(**(long **)(in_RDI + 0x20) + 0x10))
                                             (*(long **)(in_RDI + 0x20),&local_1150);
              psVar5 = (string *)operator_new(0x90);
              recordType::recordType(in_stack_ffffffffffffec80);
              local_1130 = psVar5;
              std::__cxx11::string::operator=(psVar5,local_1148);
              std::__cxx11::string::operator=(local_1130 + 0x20,local_58);
              std::__cxx11::string::operator=(local_1130 + 0x40,local_38);
              std::__cxx11::string::string(local_1180,local_78);
              timeType::timeType(in_stack_ffffffffffffec50,in_stack_ffffffffffffec48);
              *(undefined8 *)(local_1130 + 0x60) = local_1160;
              *(undefined8 *)(local_1130 + 0x68) = uStack_1158;
              std::__cxx11::string::~string(local_1180);
              bVar1 = trainType::getrecord
                                (in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0,
                                 SUB81((ulong)in_stack_ffffffffffffecc8 >> 0x38,0));
              if (bVar1) {
                vector<sjtu::recordType>::push_back
                          (in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
              }
              psVar5 = local_1130;
              if (local_1130 != (string *)0x0) {
                recordType::~recordType(in_stack_ffffffffffffec40);
                operator_delete(psVar5,0x90);
              }
            }
            local_1118[local_1134] = local_1138 ^ local_1118[local_1134];
          }
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffec30,(char *)in_stack_ffffffffffffec28);
        if (bVar1) {
          iVar8 = vector<sjtu::recordType>::begin((vector<sjtu::recordType> *)0x10a02b);
          iVar7 = vector<sjtu::recordType>::end((vector<sjtu::recordType> *)0x10a06a);
          std::sort<sjtu::vector<sjtu::recordType>::iterator,sjtu::cmp_time>
                    (iVar8.pos,iVar8.vec,iVar7.pos,iVar7.vec);
        }
        else {
          iVar8 = vector<sjtu::recordType>::begin((vector<sjtu::recordType> *)0x10a0d5);
          in_stack_ffffffffffffecb0 = (recordType *)iVar8.vec;
          local_11b8 = iVar8.pos;
          prVar9 = in_stack_ffffffffffffecb0;
          iVar8 = vector<sjtu::recordType>::end((vector<sjtu::recordType> *)0x10a114);
          local_11c0 = iVar8.vec;
          in_stack_ffffffffffffeca8 = iVar8.pos;
          local_11c8 = in_stack_ffffffffffffeca8;
          std::sort<sjtu::vector<sjtu::recordType>::iterator,sjtu::cmp_cost>
                    (local_11b8,prVar9,in_stack_ffffffffffffeca8,local_11c0);
        }
        sVar6 = vector<sjtu::recordType>::size(&local_1128);
        pvVar4 = (void *)std::ostream::operator<<(&std::cout,sVar6);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        local_11d8 = &local_1128;
        local_11e8 = vector<sjtu::recordType>::begin((vector<sjtu::recordType> *)0x10a1c5);
        local_11f8 = vector<sjtu::recordType>::end((vector<sjtu::recordType> *)0x10a1f8);
        while( true ) {
          bVar1 = vector<sjtu::recordType>::iterator::operator!=(&local_11e8,&local_11f8);
          if (!bVar1) break;
          vector<sjtu::recordType>::iterator::operator*(&local_11e8);
          recordType::recordType(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
          this_00 = operator<<((ostream *)in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          recordType::~recordType(in_stack_ffffffffffffec40);
          vector<sjtu::recordType>::iterator::operator++(&local_11e8);
        }
        vector<sjtu::recordType>::~vector(in_stack_ffffffffffffec30);
      }
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_78);
      psVar5 = local_58;
      this_01 = (string *)&local_18;
      do {
        this_01 = this_01 + -0x20;
        std::__cxx11::string::~string(this_01);
      } while (this_01 != psVar5);
      return;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffec30,(char *)in_stack_ffffffffffffec28);
    if (bVar1) {
      std::__cxx11::string::operator=(local_58,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffec30,(char *)in_stack_ffffffffffffec28);
      if (bVar1) {
        std::__cxx11::string::operator=
                  (local_38,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffec30,(char *)in_stack_ffffffffffffec28);
        if (bVar1) {
          std::__cxx11::string::operator=
                    (local_78,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffec30,(char *)in_stack_ffffffffffffec28);
          if (!bVar1) {
            uVar2 = __cxa_allocate_exception(0x68);
            invalid_command::invalid_command((invalid_command *)in_stack_ffffffffffffec40);
            __cxa_throw(uVar2,&invalid_command::typeinfo,invalid_command::~invalid_command);
          }
          std::__cxx11::string::operator=
                    (local_98,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
        }
      }
    }
    local_b0 = local_b0 + 2;
  } while( true );
}

Assistant:

void query_ticket(int argc , std::string *argv)
		{
			std::string station[2] , date , keyword = "";
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-s") station[0] = argv[i + 1];
				else if (argv[i] == "-t") station[1] = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else if (argv[i] == "-p") keyword = argv[i + 1];
				else throw invalid_command();
			auto ret_s = StationBpTree -> find(hasher(station[0])) , ret_t = StationBpTree -> find(hasher(station[1]));
			if (ret_s.second == false || ret_t.second == false) std::cout << 0 << std::endl;
			else
			{
				unsigned int bits[2][WS];
				bitset_query(ret_s.first , bits[0]) , bitset_query(ret_t.first , bits[1]);
				vector<recordType> records;
				recordType *record;
				for (int i = 0;i < WS;++ i)
				{
					bits[0][i] &= bits[1][i];
					for (unsigned int w;bits[0][i];bits[0][i] ^= w)
					{
						w = bits[0][i] & (-bits[0][i]);
						if (!w) continue;
						int id = -1;
						for (unsigned int w_ = w;w_;w_ >>= 1) ++ id;
						trainType *train = TrainFile -> read((i * W + id + 1) * sizeof (DynamicFileManager<trainType>::valueType));
						record = new recordType , record -> trainID = train -> trainID;
						record -> station[0] = station[0] , record -> station[1] = station[1];
						record -> time[0] = timeType(date);
						if (train -> getrecord(record)) records.push_back(*record);
						delete record;
					}
				}
				if (keyword == "time") std::sort(records.begin() , records.end() , cmp_time());
				else std::sort(records.begin() , records.end() , cmp_cost());
				std::cout << records.size() << std::endl;
				for (auto rec : records) std::cout << rec << std::endl;
			}
		}